

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::ends_with(string *value,string *ending)

{
  size_type __n;
  int iVar1;
  size_type __pos;
  
  __n = ending->_M_string_length;
  __pos = value->_M_string_length - __n;
  if (__n <= value->_M_string_length && __pos != 0) {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (value,__pos,__n,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ending);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

inline bool ends_with(std::string const& value, std::string const& ending)
{
    auto esize = ending.size();
    auto vsize = value.size();
    return (vsize > esize) ?
        (value.compare(vsize - esize, esize, ending) == 0) :
        false;
}